

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::RegexMatchImpl<true>
              (ScriptContext *scriptContext,RecyclableObject *thisObj,JavascriptString *input,
              bool noResult,void *stackAllocationPointer)

{
  bool bVar1;
  ScriptConfiguration *this;
  char16_t *varName_00;
  JavascriptRegExp *regularExpression_00;
  JavascriptRegExp *regularExpression;
  PCWSTR varName;
  ScriptConfiguration *scriptConfig;
  void *stackAllocationPointer_local;
  bool noResult_local;
  JavascriptString *input_local;
  RecyclableObject *thisObj_local;
  ScriptContext *scriptContext_local;
  
  this = ScriptContext::GetConfig(scriptContext);
  bVar1 = ScriptConfiguration::IsES6RegExSymbolsEnabled(this);
  if ((bVar1) && (bVar1 = IsRegexSymbolMatchObservable(thisObj,scriptContext), bVar1)) {
    scriptContext_local =
         (ScriptContext *)
         RegexEs6MatchImpl(scriptContext,thisObj,input,noResult,stackAllocationPointer);
  }
  else {
    bVar1 = ScriptConfiguration::IsES6RegExSymbolsEnabled(this);
    varName_00 = L"String.prototype.match";
    if (bVar1) {
      varName_00 = L"RegExp.prototype[Symbol.match]";
    }
    regularExpression_00 = JavascriptRegExp::ToRegExp(thisObj,varName_00,scriptContext);
    scriptContext_local =
         (ScriptContext *)
         RegexEs5MatchImpl<true>
                   (scriptContext,regularExpression_00,input,noResult,stackAllocationPointer);
  }
  return scriptContext_local;
}

Assistant:

Var RegexHelper::RegexMatchImpl(ScriptContext* scriptContext, RecyclableObject *thisObj, JavascriptString *input, bool noResult, void *const stackAllocationPointer)
    {
        ScriptConfiguration const * scriptConfig = scriptContext->GetConfig();

        // Normally, this check would be done in JavascriptRegExp::EntrySymbolMatch. However,
        // since the lowerer inlines String.prototype.match and directly calls the helper,
        // the check then would be bypassed. That's the reason we do the check here.
        if (scriptConfig->IsES6RegExSymbolsEnabled()
            && IsRegexSymbolMatchObservable(thisObj, scriptContext))
        {
            // We don't need to pass "updateHistory" here since the call to "exec" will handle it.
            return RegexEs6MatchImpl(scriptContext, thisObj, input, noResult, stackAllocationPointer);
        }
        else
        {
            PCWSTR varName = scriptConfig->IsES6RegExSymbolsEnabled()
                ? _u("RegExp.prototype[Symbol.match]")
                : _u("String.prototype.match");
            JavascriptRegExp* regularExpression = JavascriptRegExp::ToRegExp(thisObj, varName, scriptContext);
            return RegexEs5MatchImpl<updateHistory>(scriptContext, regularExpression, input, noResult, stackAllocationPointer);
        }
    }